

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

GetDefaultBlindingKeyRequestStruct * __thiscall
cfd::js::api::json::GetDefaultBlindingKeyRequest::ConvertToStruct
          (GetDefaultBlindingKeyRequestStruct *__return_storage_ptr__,
          GetDefaultBlindingKeyRequest *this)

{
  GetDefaultBlindingKeyRequestStruct::GetDefaultBlindingKeyRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->locking_script);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->address);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

GetDefaultBlindingKeyRequestStruct GetDefaultBlindingKeyRequest::ConvertToStruct() const {  // NOLINT
  GetDefaultBlindingKeyRequestStruct result;
  result.master_blinding_key = master_blinding_key_;
  result.locking_script = locking_script_;
  result.address = address_;
  result.ignore_items = ignore_items;
  return result;
}